

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

sxi32 SyHashDeleteEntry(SyHash *pHash,void *pKey,sxu32 nKeyLen,void **ppUserData)

{
  SyHashEntry_Pr *pSVar1;
  SyHashEntry_Pr *pSVar2;
  sxi32 sVar3;
  SyHashEntry_Pr *pChunk;
  SyHashEntry_Pr **ppSVar4;
  
  pChunk = HashGetEntry(pHash,pKey,nKeyLen);
  if (pChunk != (SyHashEntry_Pr *)0x0) {
    pSVar1 = pChunk->pNextCollide;
    if (pChunk->pPrevCollide == (SyHashEntry_Pr *)0x0) {
      ppSVar4 = pHash->apBucket + (pHash->nBucketSize - 1 & pChunk->nHash);
    }
    else {
      ppSVar4 = &pChunk->pPrevCollide->pNextCollide;
    }
    *ppSVar4 = pSVar1;
    if (pSVar1 != (SyHashEntry_Pr *)0x0) {
      pSVar1->pPrevCollide = pChunk->pPrevCollide;
    }
    if (pHash->pList == pChunk) {
      pHash->pList = pHash->pList->pNext;
    }
    pSVar1 = pChunk->pNext;
    pSVar2 = pChunk->pPrev;
    if (pSVar2 != (SyHashEntry_Pr *)0x0) {
      pSVar2->pNext = pSVar1;
    }
    if (pSVar1 != (SyHashEntry_Pr *)0x0) {
      pSVar1->pPrev = pSVar2;
    }
    pHash->nEntry = pHash->nEntry - 1;
    if (ppUserData != (void **)0x0) {
      *ppUserData = pChunk->pUserData;
    }
    sVar3 = SyMemBackendPoolFree(pHash->pAllocator,pChunk);
    return sVar3;
  }
  return -6;
}

Assistant:

JX9_PRIVATE sxi32 SyHashDeleteEntry(SyHash *pHash, const void *pKey, sxu32 nKeyLen, void **ppUserData)
{
	SyHashEntry_Pr *pEntry;
	sxi32 rc;
#if defined(UNTRUST)
	if( INVALID_HASH(pHash) ){
		return SXERR_CORRUPT;
	}
#endif
	pEntry = HashGetEntry(&(*pHash), pKey, nKeyLen);
	if( pEntry == 0 ){
		return SXERR_NOTFOUND;
	}
	rc = HashDeleteEntry(&(*pHash), pEntry, ppUserData);
	return rc;
}